

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O0

void __thiscall
tchecker::details::expression_typechecker_t::visit
          (expression_typechecker_t *this,array_expression_t *expr)

{
  bool bVar1;
  expression_type_t type;
  var_expression_t *pvVar2;
  element_type *this_00;
  expression_t *peVar3;
  element_type *this_01;
  string local_1e0;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined4 local_7c;
  shared_ptr<tchecker::typed_array_expression_t> local_78;
  undefined1 local_68 [8];
  expression_type_t expr_type;
  expression_type_t offset_type;
  shared_ptr<tchecker::typed_expression_t> typed_offset;
  undefined1 local_38 [4];
  expression_type_t variable_type;
  undefined1 local_28 [8];
  shared_ptr<const_tchecker::typed_var_expression_t> typed_variable;
  array_expression_t *expr_local;
  expression_typechecker_t *this_local;
  
  typed_variable.
  super___shared_ptr<const_tchecker::typed_var_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)expr;
  pvVar2 = array_expression_t::variable(expr);
  (**(code **)(*(long *)pvVar2 + 0x18))(pvVar2,this);
  acquire_typed_expression((expression_typechecker_t *)local_38);
  std::dynamic_pointer_cast<tchecker::typed_var_expression_t_const,tchecker::typed_expression_t>
            ((shared_ptr<tchecker::typed_expression_t> *)local_28);
  std::shared_ptr<tchecker::typed_expression_t>::~shared_ptr
            ((shared_ptr<tchecker::typed_expression_t> *)local_38);
  this_00 = std::
            __shared_ptr_access<const_tchecker::typed_var_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_tchecker::typed_var_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_28);
  type = typed_expression_t::type((typed_expression_t *)this_00);
  peVar3 = array_expression_t::offset
                     ((array_expression_t *)
                      typed_variable.
                      super___shared_ptr<const_tchecker::typed_var_expression_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi);
  (*peVar3->_vptr_expression_t[3])(peVar3,this);
  acquire_typed_expression((expression_typechecker_t *)&expr_type);
  this_01 = std::
            __shared_ptr_access<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&expr_type);
  local_68._4_4_ = typed_expression_t::type(this_01);
  bVar1 = integer_dereference(type);
  if ((bVar1) && (bVar1 = integer_valued(local_68._4_4_), bVar1)) {
    if ((type == EXPR_TYPE_LOCALINTVAR) || (type == EXPR_TYPE_LOCALINTARRAY)) {
      local_68._0_4_ = 7;
    }
    else {
      local_68._0_4_ = 6;
    }
  }
  else {
    bVar1 = clock_dereference(type);
    if ((bVar1) && (bVar1 = integer_valued(local_68._4_4_), bVar1)) {
      local_68._0_4_ = 10;
    }
    else {
      local_68._0_4_ = 0;
    }
  }
  std::
  make_shared<tchecker::typed_array_expression_t,tchecker::expression_type_t&,std::shared_ptr<tchecker::typed_var_expression_t_const>const&,std::shared_ptr<tchecker::typed_expression_t>const&>
            ((expression_type_t *)&local_78,
             (shared_ptr<const_tchecker::typed_var_expression_t> *)local_68,
             (shared_ptr<tchecker::typed_expression_t> *)local_28);
  std::shared_ptr<tchecker::typed_expression_t>::operator=(&this->_typed_expr,&local_78);
  std::shared_ptr<tchecker::typed_array_expression_t>::~shared_ptr(&local_78);
  if (local_68._0_4_ == 0) {
    if (local_68._4_4_ != EXPR_TYPE_BAD) {
      bVar1 = integer_valued(local_68._4_4_);
      if (bVar1) {
        expression_t::to_string_abi_cxx11_
                  (&local_1c0,
                   (expression_t *)
                   ((long)&(typed_variable.
                            super___shared_ptr<const_tchecker::typed_var_expression_t,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                   (long)(typed_variable.
                          super___shared_ptr<const_tchecker::typed_var_expression_t,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_vptr__Sp_counted_base[-7]));
        std::operator+(&local_1a0,"in expression ",&local_1c0);
        std::operator+(&local_180,&local_1a0,", invalid array variable ");
        pvVar2 = array_expression_t::variable
                           ((array_expression_t *)
                            typed_variable.
                            super___shared_ptr<const_tchecker::typed_var_expression_t,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi);
        expression_t::to_string_abi_cxx11_
                  (&local_1e0,
                   (expression_t *)(&pvVar2->field_0x0 + *(long *)(*(long *)pvVar2 + -0x38)));
        std::operator+(&local_160,&local_180,&local_1e0);
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()(&this->_error,&local_160);
        std::__cxx11::string::~string((string *)&local_160);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_180);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1c0);
      }
      else {
        expression_t::to_string_abi_cxx11_
                  (&local_120,
                   (expression_t *)
                   ((long)&(typed_variable.
                            super___shared_ptr<const_tchecker::typed_var_expression_t,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi)->_vptr__Sp_counted_base +
                   (long)(typed_variable.
                          super___shared_ptr<const_tchecker::typed_var_expression_t,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi)->_vptr__Sp_counted_base[-7]));
        std::operator+(&local_100,"in expression ",&local_120);
        std::operator+(&local_e0,&local_100,", array subscript ");
        peVar3 = array_expression_t::offset
                           ((array_expression_t *)
                            typed_variable.
                            super___shared_ptr<const_tchecker::typed_var_expression_t,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi);
        expression_t::to_string_abi_cxx11_(&local_140,peVar3);
        std::operator+(&local_c0,&local_e0,&local_140);
        std::operator+(&local_a0,&local_c0," does not have an integral value");
        std::
        function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()(&this->_error,&local_a0);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_100);
        std::__cxx11::string::~string((string *)&local_120);
      }
    }
    local_7c = 0;
  }
  else {
    local_7c = 1;
  }
  std::shared_ptr<tchecker::typed_expression_t>::~shared_ptr
            ((shared_ptr<tchecker::typed_expression_t> *)&expr_type);
  std::shared_ptr<const_tchecker::typed_var_expression_t>::~shared_ptr
            ((shared_ptr<const_tchecker::typed_var_expression_t> *)local_28);
  return;
}

Assistant:

virtual void visit(tchecker::array_expression_t const & expr)
  {
    // Typecheck variable
    expr.variable().visit(*this);
    auto const typed_variable = std::dynamic_pointer_cast<tchecker::typed_var_expression_t const>(acquire_typed_expression());
    auto const variable_type = typed_variable->type();

    // Typecheck offset
    expr.offset().visit(*this);
    auto const typed_offset = acquire_typed_expression();
    auto const offset_type = typed_offset->type();

    // Typed expression
    enum tchecker::expression_type_t expr_type;

    if (integer_dereference(variable_type) && integer_valued(offset_type)) {
      if ((variable_type == tchecker::EXPR_TYPE_LOCALINTVAR) || (variable_type == tchecker::EXPR_TYPE_LOCALINTARRAY))
        expr_type = tchecker::EXPR_TYPE_LOCALINTLVALUE;
      else
        expr_type = tchecker::EXPR_TYPE_INTLVALUE;
    }
    else if (clock_dereference(variable_type) && integer_valued(offset_type))
      expr_type = tchecker::EXPR_TYPE_CLKLVALUE;
    else
      expr_type = tchecker::EXPR_TYPE_BAD;

    _typed_expr = std::make_shared<tchecker::typed_array_expression_t>(expr_type, typed_variable, typed_offset);

    // Report bad type
    if (expr_type != tchecker::EXPR_TYPE_BAD)
      return;

    if (offset_type != tchecker::EXPR_TYPE_BAD) {
      if (!integer_valued(offset_type))
        _error("in expression " + expr.to_string() + ", array subscript " + expr.offset().to_string() +
               " does not have an integral value");
      else
        _error("in expression " + expr.to_string() + ", invalid array variable " + expr.variable().to_string());
    }
  }